

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_case(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  LY_ERR LVar1;
  lysp_node_case *cs_p;
  lysp_node *child_p;
  LY_ERR ret;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  if ((pnode->nodetype & 0xc002) == 0) {
    if (pnode->nodetype != 0x80) {
      ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
             ,0xecb);
      return LY_EINT;
    }
    for (cs_p = (lysp_node_case *)pnode[1].parent; cs_p != (lysp_node_case *)0x0;
        cs_p = (lysp_node_case *)(cs_p->field_0).node.next) {
      LVar1 = lys_compile_node(ctx,(lysp_node *)cs_p,node,0,(ly_set *)0x0);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
  }
  LVar1 = lys_compile_node_augments(ctx,node);
  return LVar1;
}

Assistant:

static LY_ERR
lys_compile_node_case(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p;
    struct lysp_node_case *cs_p = (struct lysp_node_case *)pnode;

    if (pnode->nodetype & (LYS_CHOICE | LYS_AUGMENT | LYS_GROUPING)) {
        /* we have to add an implicit case node into the parent choice */
    } else if (pnode->nodetype == LYS_CASE) {
        /* explicit parent case */
        LY_LIST_FOR(cs_p->child, child_p) {
            LY_CHECK_GOTO(ret = lys_compile_node(ctx, child_p, node, 0, NULL), done);
        }
    } else {
        LOGINT_RET(ctx->ctx);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

done:
    return ret;
}